

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O3

vm_tzobj_ext * vm_tzobj_ext::alloc_ext(CVmObjTimeZone *self,CVmTimeZone *tz)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,8,self);
  ((vm_tzobj_ext *)CONCAT44(extraout_var,iVar1))->tz = tz;
  return (vm_tzobj_ext *)CONCAT44(extraout_var,iVar1);
}

Assistant:

vm_tzobj_ext *vm_tzobj_ext::alloc_ext(VMG_ CVmObjTimeZone *self,
                                      CVmTimeZone *tz)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_tzobj_ext);

    /* allocate the memory */
    vm_tzobj_ext *ext = (vm_tzobj_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* save our TimeZone object */
    ext->tz = tz;

    /* return the new extension */
    return ext;
}